

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDAttDef.cpp
# Opt level: O1

bool __thiscall xercesc_4_0::DTDAttDef::isSerializable(DTDAttDef *this)

{
  return true;
}

Assistant:

void DTDAttDef::serialize(XSerializeEngine& serEng)
{

    XMLAttDef::serialize(serEng);

    if (serEng.isStoring())
    {
        serEng.writeSize (fElemId);
        serEng.writeString(fName);
    }
    else
    {
        serEng.readSize (fElemId);
        serEng.readString(fName);
    }
}